

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSerializerTest.cpp
# Opt level: O3

SAX2XMLReader * getParser(XMLGrammarPool *theGramPool,bool setHandler)

{
  SAX2XMLReader *pSVar1;
  ContentHandler *pCVar2;
  ErrorHandler *pEVar3;
  
  pSVar1 = (SAX2XMLReader *)
           xercesc_4_0::XMLReaderFactory::createXMLReader
                     (*(MemoryManager **)(theGramPool + 8),theGramPool);
  (*pSVar1->_vptr_SAX2XMLReader[0xc])
            (pSVar1,&xercesc_4_0::XMLUni::fgSAX2CoreNameSpaces,(ulong)(doNamespaces ^ 1));
  (*pSVar1->_vptr_SAX2XMLReader[0xc])
            (pSVar1,&xercesc_4_0::XMLUni::fgXercesSchema,(ulong)(doSchema ^ 1));
  (*pSVar1->_vptr_SAX2XMLReader[0xc])(pSVar1,&xercesc_4_0::XMLUni::fgXercesHandleMultipleImports,1);
  (*pSVar1->_vptr_SAX2XMLReader[0xc])
            (pSVar1,&xercesc_4_0::XMLUni::fgXercesSchemaFullChecking,(ulong)schemaFullChecking);
  (*pSVar1->_vptr_SAX2XMLReader[0xc])
            (pSVar1,&xercesc_4_0::XMLUni::fgSAX2CoreNameSpacePrefixes,(ulong)namespacePrefixes);
  if (valScheme == Val_Auto) {
    (*pSVar1->_vptr_SAX2XMLReader[0xc])(pSVar1,&xercesc_4_0::XMLUni::fgSAX2CoreValidation,1);
    (*pSVar1->_vptr_SAX2XMLReader[0xc])(pSVar1,&xercesc_4_0::XMLUni::fgXercesDynamic,1);
  }
  if (valScheme == Val_Never) {
    (*pSVar1->_vptr_SAX2XMLReader[0xc])(pSVar1,&xercesc_4_0::XMLUni::fgSAX2CoreValidation,0);
  }
  if (valScheme == Val_Always) {
    (*pSVar1->_vptr_SAX2XMLReader[0xc])(pSVar1,&xercesc_4_0::XMLUni::fgSAX2CoreValidation,1);
    (*pSVar1->_vptr_SAX2XMLReader[0xc])(pSVar1,&xercesc_4_0::XMLUni::fgXercesDynamic,0);
  }
  if (setHandler) {
    pCVar2 = &(handler->super_DefaultHandler).super_ContentHandler;
    if (handler == (XSerializerHandlers *)0x0) {
      pCVar2 = (ContentHandler *)0x0;
    }
    (*pSVar1->_vptr_SAX2XMLReader[8])(pSVar1,pCVar2);
    pEVar3 = &(handler->super_DefaultHandler).super_ErrorHandler;
    if (handler == (XSerializerHandlers *)0x0) {
      pEVar3 = (ErrorHandler *)0x0;
    }
  }
  else {
    pEVar3 = (ErrorHandler *)0x0;
    (*pSVar1->_vptr_SAX2XMLReader[8])(pSVar1,0);
  }
  (*pSVar1->_vptr_SAX2XMLReader[0xb])(pSVar1,pEVar3);
  return pSVar1;
}

Assistant:

static SAX2XMLReader* getParser(XMLGrammarPool* const theGramPool
                              , bool                  setHandler)
{
    SAX2XMLReader* parser = XMLReaderFactory::createXMLReader(theGramPool->getMemoryManager(), theGramPool);

    parser->setFeature(XMLUni::fgSAX2CoreNameSpaces, doNamespaces);
    parser->setFeature(XMLUni::fgXercesSchema, doSchema);
    parser->setFeature(XMLUni::fgXercesHandleMultipleImports, true);
    parser->setFeature(XMLUni::fgXercesSchemaFullChecking, schemaFullChecking);
    parser->setFeature(XMLUni::fgSAX2CoreNameSpacePrefixes, namespacePrefixes);

    if (valScheme == SAX2XMLReader::Val_Auto)
    {
        parser->setFeature(XMLUni::fgSAX2CoreValidation, true);
        parser->setFeature(XMLUni::fgXercesDynamic, true);
    }
    if (valScheme == SAX2XMLReader::Val_Never)
    {
        parser->setFeature(XMLUni::fgSAX2CoreValidation, false);
    }
    if (valScheme == SAX2XMLReader::Val_Always)
    {
        parser->setFeature(XMLUni::fgSAX2CoreValidation, true);
        parser->setFeature(XMLUni::fgXercesDynamic, false);
    }

    if (setHandler)
    {
        parser->setContentHandler(handler);
        parser->setErrorHandler(handler);
    }
    else
    {
        parser->setContentHandler(0);
        parser->setErrorHandler(0);
    }

    return parser;
}